

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O2

string * __thiscall
VideoHppGenerator::generateStructMembers
          (string *__return_storage_ptr__,VideoHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
          *structData)

{
  pointer this_00;
  pointer pcVar1;
  bool bVar2;
  const_iterator cVar3;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string type;
  string local_c8;
  _Base_ptr local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
  *local_a0;
  pointer local_98;
  string local_90;
  string valueName;
  string prefix;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98 = (structData->second).members.
             super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = &this->m_enums;
  local_a8 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
  __rhs = &((structData->second).members.
            super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
            ._M_impl.super__Vector_impl_data._M_start)->name;
  do {
    this_00 = (pointer)(__rhs + -3);
    if (this_00 == local_98) {
      return __return_storage_ptr__;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"    ");
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    type.field_2._M_local_buf[0] = '\0';
    if (__rhs[2]._M_dataplus._M_p == (pointer)0x0) {
LAB_0010a730:
      if (__rhs[1]._M_dataplus._M_p == (pointer)__rhs[1]._M_string_length) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueName,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE",
                   (allocator<char> *)&local_c8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"StdVideo",&local_ea)
        ;
        TypeInfo::compose(&prefix,(TypeInfo *)this_00,&valueName,&local_90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&type,&prefix);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&local_90);
        this_01 = &valueName;
      }
      else {
        if ((__rhs[-3]._M_string_length != 0) || (__rhs[-1]._M_string_length != 0)) {
          __assert_fail("member.type.prefix.empty() && member.type.postfix.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                        ,0x163,
                        "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                       );
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE",&local_ea)
        ;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Vk",&local_e9);
        TypeInfo::compose(&valueName,(TypeInfo *)this_00,&local_90,&local_c8);
        generateStandardArrayWrapper
                  (&prefix,&valueName,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(__rhs + 1));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&type,&prefix);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&valueName);
        std::__cxx11::string::~string((string *)&local_c8);
        this_01 = &local_90;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(__rhs + -2,"StdVideo");
      if (!bVar2) goto LAB_0010a730;
      if ((__rhs[-3]._M_string_length != 0) || (__rhs[-1]._M_string_length != 0)) {
        __assert_fail("member.type.prefix.empty() && member.type.postfix.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0x15a,
                      "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                     );
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&type,__rhs + -2);
    }
    std::operator+(&valueName,&type," ");
    std::operator+(&prefix,&valueName,__rhs);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&valueName);
    pcVar1 = __rhs[2]._M_dataplus._M_p;
    if (__rhs[1]._M_dataplus._M_p == (pointer)__rhs[1]._M_string_length) {
      if (pcVar1 == (pointer)0x0) goto LAB_0010a88b;
      std::operator+(&prefix," : ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__rhs[1].field_2 + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&prefix);
LAB_0010a9e2:
      std::__cxx11::string::~string((string *)&prefix);
    }
    else {
      if (pcVar1 != (pointer)0x0) {
        __assert_fail("member.arraySizes.empty() || member.bitCount.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0x169,
                      "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                     );
      }
LAB_0010a88b:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__," = ");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
              ::find(&local_a0->_M_t,__rhs + -2);
      if ((cVar3._M_node != local_a8 &&
           __rhs[1]._M_dataplus._M_p == (pointer)__rhs[1]._M_string_length) &&
         (__rhs[-1]._M_string_length == 0)) {
        if ((__rhs[-3]._M_string_length != 0) ||
           (*(_Base_ptr *)(cVar3._M_node + 2) == cVar3._M_node[2]._M_parent)) {
          __assert_fail("member.type.prefix.empty() && member.arraySizes.empty() && !enumIt->second.values.empty()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                        ,0x175,
                        "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                       );
        }
        toUpperCase(&valueName,__rhs + -2);
        std::operator+(&prefix,&valueName,"_");
        std::__cxx11::string::~string((string *)&valueName);
        stripPrefix(&local_c8,(string *)(*(long *)(cVar3._M_node + 2) + 0x18),&prefix);
        toCamelCase(&local_90,&local_c8,true);
        std::operator+(&valueName,"e",&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_c8);
        std::operator+(&local_c8,&type,"::");
        std::operator+(&local_90,&local_c8,&valueName);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&valueName);
        goto LAB_0010a9e2;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"{}");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,";\n");
    std::__cxx11::string::~string((string *)&type);
    __rhs = __rhs + 6;
  } while( true );
}

Assistant:

std::string VideoHppGenerator::generateStructMembers( std::pair<std::string, StructureData> const & structData ) const
{
  std::string members;
  for ( auto const & member : structData.second.members )
  {
    members += "    ";
    std::string type;
    if ( !member.bitCount.empty() && member.type.type.starts_with( "StdVideo" ) )
    {
      assert( member.type.prefix.empty() && member.type.postfix.empty() );  // never encounterd a different case
      type = member.type.type;
    }
    else if ( member.arraySizes.empty() )
    {
      type = member.type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE", "StdVideo" );
    }
    else
    {
      assert( member.type.prefix.empty() && member.type.postfix.empty() );
      type = generateStandardArrayWrapper( member.type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE" ), member.arraySizes );
    }
    members += type + " " + member.name;

    // as we don't have any meaningful default initialization values, everything can be initialized by just '{}' !
    assert( member.arraySizes.empty() || member.bitCount.empty() );
    if ( !member.bitCount.empty() )
    {
      members += " : " + member.bitCount;  // except for bitfield members, where no default member initialization
                                           // is supported (up to C++20)
    }
    else
    {
      members += " = ";
      auto enumIt = m_enums.find( member.type.type );
      if ( member.arraySizes.empty() && ( enumIt != m_enums.end() ) && member.type.postfix.empty() )
      {
        assert( member.type.prefix.empty() && member.arraySizes.empty() && !enumIt->second.values.empty() );

        std::string prefix    = toUpperCase( member.type.type ) + "_";
        std::string valueName = "e" + toCamelCase( stripPrefix( enumIt->second.values.front().name, prefix ), true );

        members += type + "::" + valueName;
      }
      else
      {
        members += "{}";
      }
    }
    members += ";\n";
  }
  return members;
}